

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O3

wchar_t archive_write_mtree_free(archive_write *a)

{
  mtree_writer *mtree;
  mtree_entry_conflict *pmVar1;
  mtree_entry_conflict *me;
  
  mtree = (mtree_writer *)a->format_data;
  if (mtree != (mtree_writer *)0x0) {
    me = (mtree->file_list).first;
    while (me != (mtree_entry_conflict *)0x0) {
      pmVar1 = me->next;
      mtree_entry_free(me);
      me = pmVar1;
    }
    archive_string_free(&mtree->cur_dirstr);
    archive_string_free(&mtree->ebuf);
    archive_string_free(&mtree->buf);
    attr_counter_set_free(mtree);
    free(mtree);
    a->format_data = (void *)0x0;
  }
  return L'\0';
}

Assistant:

static int
archive_write_mtree_free(struct archive_write *a)
{
	struct mtree_writer *mtree= a->format_data;

	if (mtree == NULL)
		return (ARCHIVE_OK);

	/* Make sure we do not leave any entries. */
	mtree_entry_register_free(mtree);
	archive_string_free(&mtree->cur_dirstr);
	archive_string_free(&mtree->ebuf);
	archive_string_free(&mtree->buf);
	attr_counter_set_free(mtree);
	free(mtree);
	a->format_data = NULL;
	return (ARCHIVE_OK);
}